

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padringdb.h
# Opt level: O0

void __thiscall PadringDB::onArea(PadringDB *this,double x,double y)

{
  double y_local;
  double x_local;
  PadringDB *this_local;
  
  this->m_dieWidth = x;
  this->m_dieHeight = y;
  Layout::setDieSize(&this->m_north,x);
  Layout::setDieSize(&this->m_south,x);
  Layout::setDieSize(&this->m_east,y);
  Layout::setDieSize(&this->m_west,y);
  Layout::setEdgePos(&this->m_north,y);
  Layout::setEdgePos(&this->m_east,x);
  return;
}

Assistant:

virtual void onArea(double x, double y) override
    {
        m_dieWidth  = x;
        m_dieHeight = y;
        
        m_north.setDieSize(x);
        m_south.setDieSize(x);
        m_east.setDieSize(y);
        m_west.setDieSize(y);

        m_north.setEdgePos(y);
        m_east.setEdgePos(x);        
    }